

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

bool __thiscall QFSFileEngine::rename_helper(QFSFileEngine *this,QString *newName,RenameMode mode)

{
  QAbstractFileEnginePrivate *pQVar1;
  char cVar2;
  code *pcVar3;
  long in_FS_OFFSET;
  QSystemError error;
  QFileSystemEntry newEntry;
  QString local_88;
  undefined8 local_70;
  undefined1 local_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  if (mode == Rename) {
    pcVar3 = QFileSystemEngine::renameFile;
  }
  else {
    pcVar3 = QFileSystemEngine::renameOverwriteFile;
  }
  local_70 = 0;
  local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,newName);
  cVar2 = (*pcVar3)(pQVar1 + 1,(QFileSystemEntry *)local_68,&local_70);
  if (cVar2 == '\0') {
    QSystemError::string(&local_88,local_70._4_4_,(int)local_70);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,RenameError,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    setFileEntry(this,(QFileSystemEntry *)local_68);
  }
  if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::rename_helper(const QString &newName, RenameMode mode)
{
    Q_D(QFSFileEngine);

    auto func = mode == Rename ? QFileSystemEngine::renameFile
                               : QFileSystemEngine::renameOverwriteFile;
    QSystemError error;
    auto newEntry = QFileSystemEntry(newName);
    const bool ret = func(d->fileEntry, newEntry, error);
    if (!ret) {
        setError(QFile::RenameError, error.toString());
        return false;
    }
    setFileEntry(std::move(newEntry));
    return true;
}